

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

bool __thiscall CDirectiveFile::Validate(CDirectiveFile *this,ValidateState *state)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  FileManager *this_01;
  int64_t iVar2;
  Architecture *pAVar3;
  char **in_RCX;
  FileManager local_50;
  ValidateState *local_20;
  ValidateState *state_local;
  CDirectiveFile *this_local;
  
  local_20 = state;
  state_local = (ValidateState *)this;
  if ((state->noFileChange & 1U) == 0) {
    iVar2 = FileManager::getVirtualAddress(g_fileManager);
    this->virtualAddress = iVar2;
    pAVar3 = Architecture::current();
    (*pAVar3->_vptr_Architecture[3])();
    this_01 = g_fileManager;
    iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
    if (iVar1 != 0) {
      if (iVar1 - 1U < 3) {
        this_00 = &local_50.activeFile.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount;
        std::shared_ptr<AssemblerFile>::shared_ptr<GenericAssemblerFile,void>
                  ((shared_ptr<AssemblerFile> *)this_00,&this->file);
        FileManager::openFile(this_01,(shared_ptr<AssemblerFile> *)this_00,true);
        std::shared_ptr<AssemblerFile>::~shared_ptr
                  ((shared_ptr<AssemblerFile> *)
                   &local_50.activeFile.
                    super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else if (iVar1 == 4) {
        FileManager::getOpenFile(&local_50);
        std::shared_ptr<AssemblerFile>::operator=
                  (&this->closeFile,(shared_ptr<AssemblerFile> *)&local_50);
        std::shared_ptr<AssemblerFile>::~shared_ptr((shared_ptr<AssemblerFile> *)&local_50);
        FileManager::closeFile(g_fileManager);
      }
    }
  }
  else if (*(int *)&(this->super_CAssemblerCommand).field_0x14 == 4) {
    Logger::queueError<char_const*>
              ((Logger *)0x1,0x2293cc,(char *)&state->noFileChangeDirective,in_RCX);
  }
  else {
    Logger::queueError<char_const*>
              ((Logger *)0x1,0x2293e8,(char *)&state->noFileChangeDirective,in_RCX);
  }
  return false;
}

Assistant:

bool CDirectiveFile::Validate(const ValidateState &state)
{
	if (state.noFileChange)
	{
		if (type == Type::Close)
			Logger::queueError(Logger::Error, "Cannot close file within %S", state.noFileChangeDirective);
		else
			Logger::queueError(Logger::Error, "Cannot open new file within %S", state.noFileChangeDirective);
		return false;
	}

	virtualAddress = g_fileManager->getVirtualAddress();
	Architecture::current().NextSection();

	switch (type)
	{
	case Type::Open:
	case Type::Create:
	case Type::Copy:
		g_fileManager->openFile(file,true);
		return false;
	case Type::Close:
		closeFile = g_fileManager->getOpenFile();
		g_fileManager->closeFile();
		return false;
	case Type::Invalid:
		break;
	}
	
	return false;
}